

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

Test * BuildTokenTestCompleteThreeStepsParallel::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x510);
  BuildTokenTestCompleteThreeStepsParallel((BuildTokenTestCompleteThreeStepsParallel *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(BuildTokenTest, CompleteThreeStepsParallel) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule token-available\n"
"  command = cat $in > $out\n"
"build out1: token-available in1\n"
"build out2: token-available in2\n"
"build out12: cat out1 out2\n"));

  // plan should execute more than one command
  string err;
  EXPECT_TRUE(builder_.AddTarget("out12", &err));
  ASSERT_EQ("", err);

  // allow running of all commands
  ExpectCanRunMore(4,     true, true,  true,  true);
  ExpectAcquireToken(4,   true, false, true,  true);
  // wait for commands to finalize
  ExpectWaitForCommand(4, true, false, false, false);

  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_EQ("", err);

  EXPECT_EQ(3u, token_command_runner_.commands_ran_.size());
  EXPECT_TRUE((token_command_runner_.commands_ran_[0] == "cat in1 > out1" &&
               token_command_runner_.commands_ran_[1] == "cat in2 > out2") ||
              (token_command_runner_.commands_ran_[0] == "cat in2 > out2" &&
               token_command_runner_.commands_ran_[1] == "cat in1 > out1"));
  EXPECT_TRUE(token_command_runner_.commands_ran_[2] == "cat out1 out2 > out12");
}